

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::delete_root_subtree
          (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *this)

{
  bool bVar1;
  reference pvVar2;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  
  bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==(&this->root,(nullptr_t)0x0)
  ;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    detail::
    basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
    ::delete_subtree((basic_node_ptr<unodb::detail::node_header>)(this->root).tagged_ptr,this);
  }
  pvVar2 = std::array<unsigned_long,_5UL>::operator[](&this->node_counts,0);
  if (*pvVar2 != 0) {
    __assert_fail("node_counts[as_i<node_type::LEAF>] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                  ,0x5bf,
                  "void unodb::db<std::span<const std::byte>, std::span<const std::byte>>::delete_root_subtree() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  return;
}

Assistant:

void db<Key, Value>::delete_root_subtree() noexcept {
  if (root != nullptr) art_policy::delete_subtree(root, *this);

#ifdef UNODB_DETAIL_WITH_STATS
  // It is possible to reset the counter to zero instead of decrementing it for
  // each leaf, but not sure the savings will be significant.
  UNODB_DETAIL_ASSERT(node_counts[as_i<node_type::LEAF>] == 0);
#endif  // UNODB_DETAIL_WITH_STATS
}